

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmsh_file_v4.cc
# Opt level: O3

ostream * lf::io::operator<<(ostream *stream,ElementType et)

{
  long lVar1;
  char *pcVar2;
  
  switch(et) {
  case EDGE2:
    pcVar2 = "EDGE2";
    break;
  case TRIA3:
    pcVar2 = "TRIA3";
    break;
  case QUAD4:
    pcVar2 = "QUAD4";
    break;
  case TET4:
    pcVar2 = "TET4";
    goto LAB_001d8397;
  case HEX8:
    pcVar2 = "HEX8";
LAB_001d8397:
    lVar1 = 4;
    goto LAB_001d846f;
  case PRISM6:
    pcVar2 = "PRISM6";
    goto LAB_001d8433;
  case PYRAMID5:
    pcVar2 = "PYRAMID5";
    goto LAB_001d844a;
  case EDGE3:
    pcVar2 = "EDGE3";
    break;
  case TRIA6:
    pcVar2 = "TRIA6";
    break;
  case QUAD9:
    pcVar2 = "QUAD9";
    break;
  case TET10:
    pcVar2 = "TET10";
    break;
  case HEX27:
    pcVar2 = "HEX27";
    break;
  case PRISM18:
    pcVar2 = "PRISM18";
    goto LAB_001d83cc;
  case PYRAMID14:
    pcVar2 = "PYRAMID14";
    goto LAB_001d840a;
  case POINT:
    pcVar2 = "POINT";
    break;
  case QUAD8:
    pcVar2 = "QUAD8";
    break;
  case HEX20:
    pcVar2 = "HEX20";
    break;
  case PRISM15:
    pcVar2 = "PRISM15";
LAB_001d83cc:
    lVar1 = 7;
    goto LAB_001d846f;
  case PYRAMID13:
    pcVar2 = "PYRAMID13";
LAB_001d840a:
    lVar1 = 9;
    goto LAB_001d846f;
  case TRIA9:
    pcVar2 = "TRIA9";
    break;
  case TRIA10:
    pcVar2 = "TRIA10";
    goto LAB_001d8433;
  case TRIA12:
    pcVar2 = "TRIA12";
    goto LAB_001d8433;
  case TRIA15:
    pcVar2 = "TRIA15";
    goto LAB_001d8433;
  case TRIA15_5:
    pcVar2 = "TRIA15_5";
LAB_001d844a:
    lVar1 = 8;
    goto LAB_001d846f;
  case TRIA21:
    pcVar2 = "TRIA21";
LAB_001d8433:
    lVar1 = 6;
    goto LAB_001d846f;
  case EDGE4:
    pcVar2 = "EDGE4";
    break;
  case EDGE5:
    pcVar2 = "EDGE5";
    break;
  case EDGE6:
    pcVar2 = "EDGE6";
    break;
  case TET20:
    pcVar2 = "TET20";
    break;
  case TET35:
    pcVar2 = "TET35";
    break;
  case TET56:
    pcVar2 = "TET56";
    break;
  default:
    if (et != HEX64) {
      if (et != HEX125) {
        return stream;
      }
      pcVar2 = "HEX125";
      goto LAB_001d8433;
    }
    pcVar2 = "HEX64";
  }
  lVar1 = 5;
LAB_001d846f:
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar2,lVar1);
  return stream;
}

Assistant:

std::ostream& operator<<(std::ostream& stream, GMshFileV4::ElementType et) {
  switch (et) {
    default:
      break;
    case GMshFileV4::ElementType::EDGE2:
      stream << "EDGE2";
      break;
    case GMshFileV4::ElementType::TRIA3:
      stream << "TRIA3";
      break;
    case GMshFileV4::ElementType::QUAD4:
      stream << "QUAD4";
      break;
    case GMshFileV4::ElementType::TET4:
      stream << "TET4";
      break;
    case GMshFileV4::ElementType::HEX8:
      stream << "HEX8";
      break;
    case GMshFileV4::ElementType::PRISM6:
      stream << "PRISM6";
      break;
    case GMshFileV4::ElementType::PYRAMID5:
      stream << "PYRAMID5";
      break;
    case GMshFileV4::ElementType::EDGE3:
      stream << "EDGE3";
      break;
    case GMshFileV4::ElementType::TRIA6:
      stream << "TRIA6";
      break;
    case GMshFileV4::ElementType::QUAD9:
      stream << "QUAD9";
      break;
    case GMshFileV4::ElementType::TET10:
      stream << "TET10";
      break;
    case GMshFileV4::ElementType::HEX27:
      stream << "HEX27";
      break;
    case GMshFileV4::ElementType::PRISM18:
      stream << "PRISM18";
      break;
    case GMshFileV4::ElementType::PYRAMID14:
      stream << "PYRAMID14";
      break;
    case GMshFileV4::ElementType::POINT:
      stream << "POINT";
      break;
    case GMshFileV4::ElementType::QUAD8:
      stream << "QUAD8";
      break;
    case GMshFileV4::ElementType::HEX20:
      stream << "HEX20";
      break;
    case GMshFileV4::ElementType::PRISM15:
      stream << "PRISM15";
      break;
    case GMshFileV4::ElementType::PYRAMID13:
      stream << "PYRAMID13";
      break;
    case GMshFileV4::ElementType::TRIA9:
      stream << "TRIA9";
      break;
    case GMshFileV4::ElementType::TRIA10:
      stream << "TRIA10";
      break;
    case GMshFileV4::ElementType::TRIA12:
      stream << "TRIA12";
      break;
    case GMshFileV4::ElementType::TRIA15:
      stream << "TRIA15";
      break;
    case GMshFileV4::ElementType::TRIA15_5:
      stream << "TRIA15_5";
      break;
    case GMshFileV4::ElementType::TRIA21:
      stream << "TRIA21";
      break;
    case GMshFileV4::ElementType::EDGE4:
      stream << "EDGE4";
      break;
    case GMshFileV4::ElementType::EDGE5:
      stream << "EDGE5";
      break;
    case GMshFileV4::ElementType::EDGE6:
      stream << "EDGE6";
      break;
    case GMshFileV4::ElementType::TET20:
      stream << "TET20";
      break;
    case GMshFileV4::ElementType::TET35:
      stream << "TET35";
      break;
    case GMshFileV4::ElementType::TET56:
      stream << "TET56";
      break;
    case GMshFileV4::ElementType::HEX64:
      stream << "HEX64";
      break;
    case GMshFileV4::ElementType::HEX125:
      stream << "HEX125";
      break;
  }
  return stream;
}